

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O1

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  uint *puVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  undefined1 auVar15 [32];
  uint *puVar16;
  int iVar17;
  ulong *puVar18;
  int iVar19;
  long lVar20;
  float *pfVar21;
  ulong *puVar22;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  iVar3 = bottom_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    iVar6 = bottom_blob->w;
    pvVar9 = top_blob->data;
    sVar10 = top_blob->cstep;
    sVar11 = top_blob->elemsize;
    pvVar12 = bottom_blob->data;
    sVar13 = bottom_blob->cstep;
    sVar14 = bottom_blob->elemsize;
    lVar23 = (long)((iVar6 - iVar4) * 2);
    lVar20 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = *(float *)((long)pvVar8 + lVar20 * 4);
      }
      if (0 < iVar5) {
        pfVar21 = (float *)(sVar10 * sVar11 * lVar20 + (long)pvVar9);
        puVar22 = (ulong *)(sVar13 * sVar14 * lVar20 + (long)pvVar12);
        puVar18 = puVar22 + iVar6;
        puVar16 = (uint *)((long)puVar22 + (long)iVar6 * 4);
        iVar19 = 0;
        do {
          iVar17 = iVar4 + 1;
          if (0 < iVar4) {
            do {
              auVar25._8_8_ = 0;
              auVar25._0_8_ = *puVar22;
              auVar25 = vinsertps_avx(auVar25,ZEXT416((uint)puVar22[1]),0x20);
              puVar22 = puVar22 + 1;
              auVar25 = vinsertps_avx(auVar25,ZEXT416(*puVar16),0x30);
              puVar1 = puVar16 + 1;
              puVar16 = puVar16 + 2;
              auVar28._16_8_ = *(undefined8 *)puVar1;
              auVar28._0_16_ = auVar25;
              auVar28._24_8_ = 0;
              auVar27._16_8_ = *puVar18;
              auVar27._0_16_ = auVar25;
              auVar27._24_8_ = 0;
              auVar27 = vshufpd_avx(auVar28,auVar27,2);
              pfVar2 = (float *)((long)pvVar7 + lVar20 * 0x24);
              auVar26._0_4_ = auVar27._0_4_ * *pfVar2;
              auVar26._4_4_ = auVar27._4_4_ * pfVar2[1];
              auVar26._8_4_ = auVar27._8_4_ * pfVar2[2];
              auVar26._12_4_ = auVar27._12_4_ * pfVar2[3];
              auVar15._16_4_ = auVar27._16_4_ * pfVar2[4];
              auVar15._0_16_ = auVar26;
              auVar15._20_4_ = auVar27._20_4_ * pfVar2[5];
              auVar15._24_4_ = auVar27._24_4_ * pfVar2[6];
              auVar15._28_4_ = auVar27._28_4_;
              pfVar2 = (float *)(puVar18 + 1);
              puVar18 = puVar18 + 1;
              auVar25 = vhaddps_avx(auVar15._16_16_,auVar26);
              auVar25 = vhaddps_avx(auVar25,auVar25);
              auVar25 = vhaddps_avx(auVar25,auVar25);
              *pfVar21 = *(float *)((long)pvVar7 + lVar20 * 0x24 + 0x20) * *pfVar2 + fVar24 +
                         auVar25._0_4_;
              pfVar21 = pfVar21 + 1;
              iVar17 = iVar17 + -1;
            } while (1 < iVar17);
          }
          puVar22 = (ulong *)((long)puVar22 + lVar23 * 4);
          puVar16 = puVar16 + lVar23;
          puVar18 = (ulong *)((long)puVar18 + lVar23 * 4);
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar5);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}